

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjTypeSpecFldInfo.cpp
# Opt level: O1

ObjTypeSpecFldInfo * __thiscall
ObjTypeSpecFldInfoArray::GetInfo
          (ObjTypeSpecFldInfoArray *this,FunctionBody *functionBody,uint index)

{
  WriteBarrierPtr<ObjTypeSpecFldInfo> *pWVar1;
  ObjTypeSpecFldInfo *pOVar2;
  code *pcVar3;
  bool bVar4;
  uint32 uVar5;
  undefined4 *puVar6;
  ObjTypeSpecFldInfo *local_30;
  
  if (functionBody == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
                       ,0x4c4,"(functionBody)","functionBody");
    if (!bVar4) goto LAB_006195f1;
    *puVar6 = 0;
  }
  if ((this->infoArray).ptr != (WriteBarrierPtr<ObjTypeSpecFldInfo> *)0x0) {
    uVar5 = Js::FunctionBody::GetCountField(functionBody,InlineCacheCount);
    if (uVar5 != this->infoCount) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
                         ,0x4c5,
                         "(this->infoArray == nullptr || functionBody->GetInlineCacheCount() == this->infoCount)"
                         ,
                         "this->infoArray == nullptr || functionBody->GetInlineCacheCount() == this->infoCount"
                        );
      if (!bVar4) goto LAB_006195f1;
      *puVar6 = 0;
    }
  }
  uVar5 = Js::FunctionBody::GetCountField(functionBody,InlineCacheCount);
  if (uVar5 <= index) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
                       ,0x4c6,"(index < functionBody->GetInlineCacheCount())",
                       "index < functionBody->GetInlineCacheCount()");
    if (!bVar4) {
LAB_006195f1:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  pWVar1 = (this->infoArray).ptr;
  if (pWVar1 == (WriteBarrierPtr<ObjTypeSpecFldInfo> *)0x0) {
    local_30 = (ObjTypeSpecFldInfo *)0x0;
  }
  else {
    pOVar2 = pWVar1[index].ptr;
    Memory::Recycler::WBSetBit((char *)&local_30);
    local_30 = pOVar2;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_30);
  }
  return local_30;
}

Assistant:

ObjTypeSpecFldInfo* ObjTypeSpecFldInfoArray::GetInfo(Js::FunctionBody *const functionBody, const uint index) const
{
    Assert(functionBody);
    Assert(this->infoArray == nullptr || functionBody->GetInlineCacheCount() == this->infoCount);
    Assert(index < functionBody->GetInlineCacheCount());
    return this->infoArray ? this->infoArray[index] : nullptr;
}